

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void AddDynamicTree(uint *ll_lengths,uint *d_lengths,uchar *bp,uchar **out,size_t *outsize)

{
  size_t sVar1;
  size_t size;
  size_t bestsize;
  int best;
  int i;
  uchar *in_stack_000001d0;
  int in_stack_000001dc;
  int in_stack_000001e0;
  int in_stack_000001e4;
  uint *in_stack_000001e8;
  uint *in_stack_000001f0;
  uchar **in_stack_00000200;
  size_t *in_stack_00000208;
  undefined8 local_38;
  undefined4 local_2c;
  
  local_38 = 0;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    sVar1 = EncodeTree(in_stack_000001f0,in_stack_000001e8,in_stack_000001e4,in_stack_000001e0,
                       in_stack_000001dc,in_stack_000001d0,in_stack_00000200,in_stack_00000208);
    if ((local_38 == 0) || (sVar1 < local_38)) {
      local_38 = sVar1;
    }
  }
  EncodeTree(in_stack_000001f0,in_stack_000001e8,in_stack_000001e4,in_stack_000001e0,
             in_stack_000001dc,in_stack_000001d0,in_stack_00000200,in_stack_00000208);
  return;
}

Assistant:

static void AddDynamicTree(const unsigned* ll_lengths,
                           const unsigned* d_lengths,
                           unsigned char* bp,
                           unsigned char** out, size_t* outsize) {
  int i;
  int best = 0;
  size_t bestsize = 0;

  for(i = 0; i < 8; i++) {
    size_t size = EncodeTree(ll_lengths, d_lengths,
                             i & 1, i & 2, i & 4,
                             0, 0, 0);
    if (bestsize == 0 || size < bestsize) {
      bestsize = size;
      best = i;
    }
  }

  EncodeTree(ll_lengths, d_lengths,
             best & 1, best & 2, best & 4,
             bp, out, outsize);
}